

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model-loader.cpp
# Opt level: O2

void __thiscall
llama_model_loader::llama_model_loader
          (llama_model_loader *this,string *fname,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *splits,bool use_mmap,bool check_tensors,llama_model_kv_override *param_overrides_p,
          llama_model_tensor_buft_override *param_tensor_buft_overrides_p)

{
  uint64_t *puVar1;
  _Rb_tree_color _Var2;
  uint16_t uVar3;
  llama_model_loader *plVar4;
  _Alloc_hider _Var5;
  gguf_context_ptr *pgVar6;
  int *piVar7;
  bool bVar8;
  ushort uVar9;
  int iVar10;
  llm_arch arch;
  llama_fver lVar11;
  undefined4 uVar12;
  char *pcVar13;
  pointer __p;
  llama_file *plVar14;
  ggml_tensor *pgVar15;
  iterator iVar16;
  long lVar17;
  size_t __n;
  pointer pbVar18;
  mapped_type *pmVar19;
  ulong uVar20;
  _Base_ptr p_Var21;
  undefined8 uVar22;
  undefined8 uVar23;
  runtime_error *prVar24;
  undefined8 uVar25;
  undefined7 in_register_00000009;
  pointer pbVar26;
  mapped_type mVar27;
  llama_ftype lVar28;
  uint uVar29;
  unsigned_short local_26c;
  uint16_t n_split;
  llama_model_loader *local_268;
  allocator_type local_259;
  string *local_258;
  uint32_t ftype_val;
  size_type local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240;
  LLM_KV *local_230;
  gguf_context_ptr *local_228;
  ggml_context *ctx;
  undefined4 local_214;
  _Base_ptr local_210;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,llama_model_loader::llama_tensor_weight>,std::_Select1st<std::pair<std::__cxx11::string_const,llama_model_loader::llama_tensor_weight>>,llama_model_loader::weight_name_comparer,std::allocator<std::pair<std::__cxx11::string_const,llama_model_loader::llama_tensor_weight>>>
  *local_208;
  undefined4 local_1fc;
  string kv_split_no;
  vector<char,_std::allocator<char>_> buf;
  __hashtable *__h;
  string local_188;
  int *local_160;
  string split_prefix;
  _Base_ptr local_138;
  undefined8 local_130;
  
  local_1fc = (undefined4)CONCAT71(in_register_00000009,use_mmap);
  this->n_kv = 0;
  this->n_tensors = 0;
  this->n_created = 0;
  (this->files).
  super__Vector_base<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>,_std::allocator<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->files).
  super__Vector_base<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>,_std::allocator<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->files).
  super__Vector_base<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>,_std::allocator<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mappings).
  super__Vector_base<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>,_std::allocator<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mappings).
  super__Vector_base<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>,_std::allocator<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mappings).
  super__Vector_base<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>,_std::allocator<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->weights_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_210 = &(this->weights_map)._M_t._M_impl.super__Rb_tree_header._M_header;
  (this->weights_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  this->n_elements = 0;
  this->n_bytes = 0;
  this->use_mmap = false;
  (this->weights_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_210;
  (this->weights_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = local_210;
  (this->weights_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_208 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,llama_model_loader::llama_tensor_weight>,std::_Select1st<std::pair<std::__cxx11::string_const,llama_model_loader::llama_tensor_weight>>,llama_model_loader::weight_name_comparer,std::allocator<std::pair<std::__cxx11::string_const,llama_model_loader::llama_tensor_weight>>>
               *)&this->weights_map;
  (this->kv_overrides)._M_h._M_buckets = &(this->kv_overrides)._M_h._M_single_bucket;
  (this->kv_overrides)._M_h._M_bucket_count = 1;
  (this->kv_overrides)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->kv_overrides)._M_h._M_element_count = 0;
  (this->kv_overrides)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->kv_overrides)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->kv_overrides)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_228 = &this->meta;
  (this->contexts).
  super__Vector_base<std::unique_ptr<ggml_context,_ggml_context_deleter>,_std::allocator<std::unique_ptr<ggml_context,_ggml_context_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->contexts).
  super__Vector_base<std::unique_ptr<ggml_context,_ggml_context_deleter>,_std::allocator<std::unique_ptr<ggml_context,_ggml_context_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->meta)._M_t.super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>._M_t.
  super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
  super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl = (gguf_context *)0x0;
  (this->contexts).
  super__Vector_base<std::unique_ptr<ggml_context,_ggml_context_deleter>,_std::allocator<std::unique_ptr<ggml_context,_ggml_context_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->arch_name)._M_dataplus._M_p = (pointer)&(this->arch_name).field_2;
  (this->arch_name)._M_string_length = 0;
  (this->arch_name).field_2._M_local_buf[0] = '\0';
  local_230 = &this->llm_kv;
  local_258 = fname;
  LLM_KV::LLM_KV(local_230,LLM_ARCH_UNKNOWN,(char *)0x0);
  (this->mmaps_used).
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mmaps_used).
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->size_done = 0;
  this->size_data = 0;
  (this->mmaps_used).
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_268 = this;
  pcVar13 = getenv("LLAMA_TRACE");
  if (pcVar13 == (char *)0x0) {
    local_214 = 0;
  }
  else {
    iVar10 = atoi(pcVar13);
    local_214 = CONCAT31((int3)((uint)iVar10 >> 8),0 < iVar10);
  }
  if (param_overrides_p != (llama_model_kv_override *)0x0) {
    for (pcVar13 = param_overrides_p->key; *pcVar13 != '\0'; pcVar13 = pcVar13 + 0x108) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ftype_val,pcVar13,(allocator<char> *)&kv_split_no);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_ftype_val == &local_240) {
        split_prefix.field_2._8_8_ = local_240._8_8_;
        split_prefix._M_dataplus._M_p = (pointer)&split_prefix.field_2;
      }
      else {
        split_prefix._M_dataplus._M_p = _ftype_val;
      }
      split_prefix.field_2._M_allocated_capacity._1_7_ = local_240._M_allocated_capacity._1_7_;
      split_prefix.field_2._M_local_buf[0] = local_240._M_local_buf[0];
      split_prefix._M_string_length = local_248;
      local_248 = 0;
      local_240._M_local_buf[0] = '\0';
      _ftype_val = (pointer)&local_240;
      memcpy(&local_138,(llama_model_kv_override *)(pcVar13 + -4),0x108);
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,llama_model_kv_override>,std::allocator<std::pair<std::__cxx11::string_const,llama_model_kv_override>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::pair<std::__cxx11::string_const,llama_model_kv_override>>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,llama_model_kv_override>,std::allocator<std::pair<std::__cxx11::string_const,llama_model_kv_override>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&this->kv_overrides,&split_prefix);
      std::__cxx11::string::~string((string *)&split_prefix);
      std::__cxx11::string::~string((string *)&ftype_val);
    }
  }
  local_268->tensor_buft_overrides = param_tensor_buft_overrides_p;
  ctx = (ggml_context *)0x0;
  __p = (pointer)gguf_init_from_file((local_258->_M_dataplus)._M_p,1);
  pgVar6 = local_228;
  std::__uniq_ptr_impl<gguf_context,_gguf_context_deleter>::reset
            ((__uniq_ptr_impl<gguf_context,_gguf_context_deleter> *)local_228,__p);
  if ((pgVar6->_M_t).super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>._M_t.
      super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
      super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl == (gguf_context *)0x0) {
    prVar24 = (runtime_error *)__cxa_allocate_exception(0x10);
    format_abi_cxx11_(&split_prefix,"%s: failed to load model from %s\n","llama_model_loader",
                      (local_258->_M_dataplus)._M_p);
    std::runtime_error::runtime_error(prVar24,(string *)&split_prefix);
    __cxa_throw(prVar24,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  LLM_KV::operator()[abi_cxx11_(&split_prefix,local_230,LLM_KV_GENERAL_ARCHITECTURE);
  get_key<std::__cxx11::string>(local_268,&split_prefix,&this->arch_name,false);
  std::__cxx11::string::~string((string *)&split_prefix);
  arch = llm_arch_from_string(&this->arch_name);
  LLM_KV::LLM_KV((LLM_KV *)&split_prefix,arch,(char *)0x0);
  *(pointer *)local_230 = split_prefix._M_dataplus._M_p;
  local_230->suffix = (char *)split_prefix._M_string_length;
  plVar14 = (llama_file *)operator_new(8);
  llama_file::llama_file(plVar14,(local_258->_M_dataplus)._M_p,"rb");
  split_prefix._M_dataplus._M_p = (pointer)plVar14;
  std::
  vector<std::unique_ptr<llama_file,std::default_delete<llama_file>>,std::allocator<std::unique_ptr<llama_file,std::default_delete<llama_file>>>>
  ::emplace_back<llama_file*>
            ((vector<std::unique_ptr<llama_file,std::default_delete<llama_file>>,std::allocator<std::unique_ptr<llama_file,std::default_delete<llama_file>>>>
              *)&this->files,(llama_file **)&split_prefix);
  std::
  vector<std::unique_ptr<ggml_context,ggml_context_deleter>,std::allocator<std::unique_ptr<ggml_context,ggml_context_deleter>>>
  ::emplace_back<ggml_context*&>
            ((vector<std::unique_ptr<ggml_context,ggml_context_deleter>,std::allocator<std::unique_ptr<ggml_context,ggml_context_deleter>>>
              *)&this->contexts,&ctx);
  pgVar15 = (ggml_tensor *)ggml_get_first_tensor(ctx);
  local_160 = &local_268->n_tensors;
  puVar1 = &local_268->n_elements;
  for (; pgVar15 != (ggml_tensor *)0x0; pgVar15 = (ggml_tensor *)ggml_get_next_tensor(ctx,pgVar15))
  {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&split_prefix,pgVar15->name,(allocator<char> *)&ftype_val);
    iVar16 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>_>,_llama_model_loader::weight_name_comparer,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>_>,_llama_model_loader::weight_name_comparer,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>_>_>
                     *)local_208,&split_prefix);
    if (iVar16._M_node != local_210) {
      prVar24 = (runtime_error *)__cxa_allocate_exception(0x10);
      uVar25 = ggml_get_name(pgVar15);
      format_abi_cxx11_((string *)&ftype_val,"invalid model: tensor \'%s\' is duplicated",uVar25);
      std::runtime_error::runtime_error(prVar24,(string *)&ftype_val);
      __cxa_throw(prVar24,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    lVar17 = ggml_nelements(pgVar15);
    *puVar1 = *puVar1 + lVar17;
    lVar17 = ggml_nbytes(pgVar15);
    local_268->n_bytes = local_268->n_bytes + lVar17;
    llama_tensor_weight::llama_tensor_weight
              ((llama_tensor_weight *)&ftype_val,
               (local_268->files).
               super__Vector_base<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>,_std::allocator<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
               super___uniq_ptr_impl<llama_file,_std::default_delete<llama_file>_>._M_t.
               super__Tuple_impl<0UL,_llama_file_*,_std::default_delete<llama_file>_>.
               super__Head_base<0UL,_llama_file_*,_false>._M_head_impl,0,
               (local_268->meta)._M_t.super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>._M_t
               .super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
               super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl,pgVar15);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,llama_model_loader::llama_tensor_weight>,std::_Select1st<std::pair<std::__cxx11::string_const,llama_model_loader::llama_tensor_weight>>,llama_model_loader::weight_name_comparer,std::allocator<std::pair<std::__cxx11::string_const,llama_model_loader::llama_tensor_weight>>>
    ::_M_emplace_unique<std::__cxx11::string&,llama_model_loader::llama_tensor_weight>
              (local_208,&split_prefix,(llama_tensor_weight *)&ftype_val);
    std::__cxx11::string::~string((string *)&split_prefix);
  }
  n_split = 0;
  LLM_KV::operator()[abi_cxx11_(&split_prefix,local_230,LLM_KV_SPLIT_COUNT);
  get_key<unsigned_short>(local_268,&split_prefix,&n_split,false);
  std::__cxx11::string::~string((string *)&split_prefix);
  if (1 < n_split) {
    local_26c = 0;
    LLM_KV::operator()[abi_cxx11_(&kv_split_no,local_230,LLM_KV_SPLIT_NO);
    get_key<unsigned_short>(local_268,&kv_split_no,&local_26c,true);
    uVar3 = n_split;
    if (local_26c != 0) {
      prVar24 = (runtime_error *)__cxa_allocate_exception(0x10);
      format_abi_cxx11_(&split_prefix,
                        "illegal split file idx: %d (file: %s), model must be loaded with the first split"
                        ,(ulong)local_26c,(local_258->_M_dataplus)._M_p);
      std::runtime_error::runtime_error(prVar24,(string *)&split_prefix);
      __cxa_throw(prVar24,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pbVar26 = (splits->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pbVar18 = (splits->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar26 == pbVar18) {
      local_188.field_2._M_allocated_capacity = 0;
      local_188._M_dataplus._M_p = (pointer)0x0;
      local_188._M_string_length = 0;
      split_prefix._M_dataplus._M_p = (pointer)&split_prefix.field_2;
      split_prefix._M_string_length = 0;
      split_prefix.field_2._M_allocated_capacity =
           split_prefix.field_2._M_allocated_capacity & 0xffffffffffffff00;
      __n = llama_path_max();
      _ftype_val = _ftype_val & 0xffffffffffffff00;
      std::vector<char,_std::allocator<char>_>::vector(&buf,__n,(value_type *)&ftype_val,&local_259)
      ;
      iVar10 = llama_split_prefix(buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_start,
                                  (long)buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                        super__Vector_impl_data._M_finish -
                                  (long)buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                        super__Vector_impl_data._M_start,
                                  (local_258->_M_dataplus)._M_p,0,(uint)uVar3);
      if (iVar10 == 0) {
        prVar24 = (runtime_error *)__cxa_allocate_exception(0x10);
        format_abi_cxx11_((string *)&ftype_val,"invalid split file name: %s",
                          (local_258->_M_dataplus)._M_p);
        std::runtime_error::runtime_error(prVar24,(string *)&ftype_val);
        __cxa_throw(prVar24,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      _ftype_val = (pointer)&local_240;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&ftype_val,
                 buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
                 ._M_start,
                 buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
                 ._M_start + iVar10);
      std::__cxx11::string::operator=((string *)&split_prefix,(string *)&ftype_val);
      std::__cxx11::string::~string((string *)&ftype_val);
      if (split_prefix._M_string_length == 0) {
        prVar24 = (runtime_error *)__cxa_allocate_exception(0x10);
        format_abi_cxx11_((string *)&ftype_val,"invalid split file: %s",
                          (local_258->_M_dataplus)._M_p);
        std::runtime_error::runtime_error(prVar24,(string *)&ftype_val);
        __cxa_throw(prVar24,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      for (uVar29 = 0; uVar3 != uVar29; uVar29 = uVar29 + 1) {
        iVar10 = llama_split_path(buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_start,
                                  (long)buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                        super__Vector_impl_data._M_finish -
                                  (long)buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                        super__Vector_impl_data._M_start,
                                  split_prefix._M_dataplus._M_p,uVar29,(uint)uVar3);
        _ftype_val = (pointer)&local_240;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&ftype_val,
                   buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start + iVar10);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_188,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ftype_val);
        std::__cxx11::string::~string((string *)&ftype_val);
      }
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                (&buf.super__Vector_base<char,_std::allocator<char>_>);
      std::__cxx11::string::~string((string *)&split_prefix);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_move_assign(splits,&local_188);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_188);
      pbVar26 = (splits->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pbVar18 = (splits->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    }
    if (n_split != (uint16_t)((uint)((int)pbVar18 - (int)pbVar26) >> 5)) {
      prVar24 = (runtime_error *)__cxa_allocate_exception(0x10);
      format_abi_cxx11_(&split_prefix,"invalid split count, given: %zu splits, but expected %d",
                        (long)(splits->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(splits->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 5,(ulong)n_split);
      std::runtime_error::runtime_error(prVar24,(string *)&split_prefix);
      __cxa_throw(prVar24,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((char)local_214 != '\0') {
      llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: loading additional %d GGUFs\n",
                         "llama_model_loader");
    }
    for (local_26c = 1; local_26c < n_split; local_26c = local_26c + 1) {
      pcVar13 = (splits->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start[local_26c]._M_dataplus._M_p;
      buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
           (pointer)gguf_init_from_file(pcVar13,1,&ctx);
      if (buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start == (pointer)0x0) {
        prVar24 = (runtime_error *)__cxa_allocate_exception(0x10);
        format_abi_cxx11_(&split_prefix,"%s: failed to load GGUF split from %s\n",
                          "llama_model_loader",pcVar13);
        std::runtime_error::runtime_error(prVar24,(string *)&split_prefix);
        __cxa_throw(prVar24,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar29 = gguf_find_key(buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_start,
                             CONCAT44(kv_split_no._M_dataplus._M_p._4_4_,
                                      (ggml_type)kv_split_no._M_dataplus._M_p));
      if ((int)uVar29 < 0) {
        prVar24 = (runtime_error *)__cxa_allocate_exception(0x10);
        format_abi_cxx11_(&split_prefix,"missing key %s in GGUF split %s",
                          CONCAT44(kv_split_no._M_dataplus._M_p._4_4_,
                                   (ggml_type)kv_split_no._M_dataplus._M_p),pcVar13);
        std::runtime_error::runtime_error(prVar24,(string *)&split_prefix);
        __cxa_throw(prVar24,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar9 = gguf_get_val_u16(buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_start,uVar29 & 0x7fffffff);
      if (uVar9 != local_26c) {
        prVar24 = (runtime_error *)__cxa_allocate_exception(0x10);
        format_abi_cxx11_(&split_prefix,"invalid split file idx: %d (file: %s), expected %d",
                          (ulong)uVar9,pcVar13,(ulong)local_26c);
        std::runtime_error::runtime_error(prVar24,(string *)&split_prefix);
        __cxa_throw(prVar24,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      plVar14 = (llama_file *)operator_new(8);
      llama_file::llama_file(plVar14,pcVar13,"rb");
      split_prefix._M_dataplus._M_p = (pointer)plVar14;
      std::
      vector<std::unique_ptr<llama_file,std::default_delete<llama_file>>,std::allocator<std::unique_ptr<llama_file,std::default_delete<llama_file>>>>
      ::emplace_back<llama_file*>
                ((vector<std::unique_ptr<llama_file,std::default_delete<llama_file>>,std::allocator<std::unique_ptr<llama_file,std::default_delete<llama_file>>>>
                  *)&this->files,(llama_file **)&split_prefix);
      std::
      vector<std::unique_ptr<ggml_context,ggml_context_deleter>,std::allocator<std::unique_ptr<ggml_context,ggml_context_deleter>>>
      ::emplace_back<ggml_context*&>
                ((vector<std::unique_ptr<ggml_context,ggml_context_deleter>,std::allocator<std::unique_ptr<ggml_context,ggml_context_deleter>>>
                  *)&this->contexts,&ctx);
      for (pgVar15 = (ggml_tensor *)ggml_get_first_tensor(ctx); pgVar15 != (ggml_tensor *)0x0;
          pgVar15 = (ggml_tensor *)ggml_get_next_tensor(ctx,pgVar15)) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&split_prefix,pgVar15->name,(allocator<char> *)&ftype_val);
        iVar16 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>_>,_llama_model_loader::weight_name_comparer,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>_>,_llama_model_loader::weight_name_comparer,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>_>_>
                         *)local_208,&split_prefix);
        if (iVar16._M_node != local_210) {
          prVar24 = (runtime_error *)__cxa_allocate_exception(0x10);
          uVar25 = ggml_get_name(pgVar15);
          format_abi_cxx11_((string *)&ftype_val,"invalid model: tensor \'%s\' is duplicated",uVar25
                           );
          std::runtime_error::runtime_error(prVar24,(string *)&ftype_val);
          __cxa_throw(prVar24,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        lVar17 = ggml_nelements(pgVar15);
        *puVar1 = *puVar1 + lVar17;
        lVar17 = ggml_nbytes(pgVar15);
        local_268->n_bytes = local_268->n_bytes + lVar17;
        llama_tensor_weight::llama_tensor_weight
                  ((llama_tensor_weight *)&ftype_val,
                   (local_268->files).
                   super__Vector_base<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>,_std::allocator<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                   super___uniq_ptr_impl<llama_file,_std::default_delete<llama_file>_>._M_t.
                   super__Tuple_impl<0UL,_llama_file_*,_std::default_delete<llama_file>_>.
                   super__Head_base<0UL,_llama_file_*,_false>._M_head_impl,local_26c,
                   (gguf_context *)
                   buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start,pgVar15);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,llama_model_loader::llama_tensor_weight>,std::_Select1st<std::pair<std::__cxx11::string_const,llama_model_loader::llama_tensor_weight>>,llama_model_loader::weight_name_comparer,std::allocator<std::pair<std::__cxx11::string_const,llama_model_loader::llama_tensor_weight>>>
        ::_M_emplace_unique<std::__cxx11::string&,llama_model_loader::llama_tensor_weight>
                  (local_208,&split_prefix,(llama_tensor_weight *)&ftype_val);
        std::__cxx11::string::~string((string *)&split_prefix);
      }
      std::unique_ptr<gguf_context,_gguf_context_deleter>::~unique_ptr
                ((unique_ptr<gguf_context,_gguf_context_deleter> *)&buf);
    }
    LLM_KV::operator()[abi_cxx11_(&split_prefix,local_230,LLM_KV_SPLIT_TENSORS_COUNT);
    piVar7 = local_160;
    plVar4 = local_268;
    get_key<int>(local_268,&split_prefix,local_160,true);
    std::__cxx11::string::~string((string *)&split_prefix);
    uVar29 = (uint)(plVar4->weights_map)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    if (plVar4->n_tensors != uVar29) {
      prVar24 = (runtime_error *)__cxa_allocate_exception(0x10);
      format_abi_cxx11_(&split_prefix,"corrupted model: %d tensors expected but %d found",
                        (ulong)(uint)*piVar7,(ulong)uVar29);
      std::runtime_error::runtime_error(prVar24,(string *)&split_prefix);
      __cxa_throw(prVar24,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: additional %d GGUFs metadata loaded.\n",
                       "llama_model_loader",(ulong)(n_split - 1));
    std::__cxx11::string::~string((string *)&kv_split_no);
  }
  iVar10 = gguf_get_n_kv((local_228->_M_t).super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>
                         ._M_t.super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
                         super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl);
  local_268->n_kv = iVar10;
  local_268->n_tensors =
       (int)(local_268->weights_map)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  lVar11 = gguf_get_version((local_268->meta)._M_t.
                            super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>._M_t.
                            super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
                            super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl);
  local_268->fver = lVar11;
  if (lVar11 - GGUF_FILE_VERSION_V1 < 3) {
    pcVar13 = (&PTR_anon_var_dwarf_14e681_002ce050)[lVar11 - GGUF_FILE_VERSION_V1];
  }
  else {
    pcVar13 = "unknown";
  }
  mVar27 = 0;
  llama_log_internal(GGML_LOG_LEVEL_INFO,
                     "%s: loaded meta data with %d key-value pairs and %d tensors from %s (version %s)\n"
                     ,"llama_model_loader",(ulong)(uint)local_268->n_kv,
                     (ulong)(uint)local_268->n_tensors,(local_258->_M_dataplus)._M_p,pcVar13);
  split_prefix.field_2._8_8_ = &split_prefix._M_string_length;
  split_prefix._M_string_length = split_prefix._M_string_length & 0xffffffff00000000;
  split_prefix.field_2._M_allocated_capacity = 0;
  local_130 = 0;
  p_Var21 = (local_268->weights_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_258 = (string *)0x0;
  local_138 = (_Base_ptr)split_prefix.field_2._8_8_;
  while( true ) {
    if (p_Var21 == local_210) break;
    pgVar15 = (ggml_tensor *)p_Var21[2]._M_left;
    kv_split_no._M_dataplus._M_p._0_4_ = pgVar15->type;
    pmVar19 = std::
              map<ggml_type,_unsigned_int,_std::less<ggml_type>,_std::allocator<std::pair<const_ggml_type,_unsigned_int>_>_>
              ::operator[]((map<ggml_type,_unsigned_int,_std::less<ggml_type>,_std::allocator<std::pair<const_ggml_type,_unsigned_int>_>_>
                            *)&split_prefix,(key_type *)&kv_split_no);
    *pmVar19 = *pmVar19 + 1;
    pmVar19 = std::
              map<ggml_type,_unsigned_int,_std::less<ggml_type>,_std::allocator<std::pair<const_ggml_type,_unsigned_int>_>_>
              ::operator[]((map<ggml_type,_unsigned_int,_std::less<ggml_type>,_std::allocator<std::pair<const_ggml_type,_unsigned_int>_>_>
                            *)&split_prefix,(key_type *)&kv_split_no);
    if (mVar27 < *pmVar19) {
      pmVar19 = std::
                map<ggml_type,_unsigned_int,_std::less<ggml_type>,_std::allocator<std::pair<const_ggml_type,_unsigned_int>_>_>
                ::operator[]((map<ggml_type,_unsigned_int,_std::less<ggml_type>,_std::allocator<std::pair<const_ggml_type,_unsigned_int>_>_>
                              *)&split_prefix,(key_type *)&kv_split_no);
      mVar27 = *pmVar19;
      local_258 = (string *)(ulong)(ggml_type)kv_split_no._M_dataplus._M_p;
    }
    if ((char)local_214 != '\0') {
      _Var2 = p_Var21[2]._M_color;
      local_230 = (LLM_KV *)ggml_get_name(pgVar15);
      uVar25 = ggml_type_name((ggml_type)kv_split_no._M_dataplus._M_p);
      llama_format_tensor_shape_abi_cxx11_((string *)&ftype_val,pgVar15);
      _Var5._M_p = _ftype_val;
      uVar20 = ggml_nbytes(pgVar15);
      llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: - tensor split %2d: %32s %-8s [ %s ] %8.2f MiB\n",
                         SUB84((double)((float)uVar20 * 0.0009765625 * 0.0009765625),0),
                         "llama_model_loader",(ulong)(ushort)(short)_Var2,local_230,uVar25,
                         _Var5._M_p);
      std::__cxx11::string::~string((string *)&ftype_val);
    }
    p_Var21 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var21);
  }
  if (((uint)local_258 < 0x24) && ((0xc60ff7dcfU >> ((ulong)local_258 & 0x3f) & 1) != 0)) {
    lVar28 = *(llama_ftype *)(&DAT_0027153c + ((ulong)local_258 & 0xffffffff) * 4);
  }
  else {
    ggml_type_name();
    lVar28 = LLAMA_FTYPE_GUESSED;
    llama_log_internal(GGML_LOG_LEVEL_WARN,"%s: unknown type %s\n","llama_model_loader");
  }
  local_268->ftype = lVar28;
  _ftype_val = _ftype_val & 0xffffffff00000000;
  bVar8 = get_key<unsigned_int>(local_268,LLM_KV_GENERAL_FILE_TYPE,&ftype_val,false);
  if (bVar8) {
    local_268->ftype = ftype_val;
  }
  llama_log_internal(GGML_LOG_LEVEL_INFO,
                     "%s: Dumping metadata keys/values. Note: KV overrides do not apply in this output.\n"
                     ,"llama_model_loader");
  for (uVar20 = 0; pgVar6 = local_228, (long)uVar20 < (long)local_268->n_kv; uVar20 = uVar20 + 1) {
    local_210 = (_Base_ptr)
                gguf_get_key((local_228->_M_t).
                             super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>._M_t.
                             super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
                             super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl,uVar20);
    iVar10 = gguf_get_kv_type((pgVar6->_M_t).
                              super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>._M_t.
                              super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
                              super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl,uVar20);
    if (iVar10 == 9) {
      uVar25 = gguf_type_name(9);
      uVar12 = gguf_get_arr_type((local_228->_M_t).
                                 super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>._M_t.
                                 super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
                                 super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl,uVar20);
      uVar22 = gguf_type_name(uVar12);
      uVar23 = gguf_get_arr_n((local_228->_M_t).
                              super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>._M_t.
                              super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
                              super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl,uVar20);
      format_abi_cxx11_((string *)&ftype_val,"%s[%s,%zu]",uVar25,uVar22,uVar23);
    }
    else {
      pcVar13 = (char *)gguf_type_name(iVar10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ftype_val,pcVar13,(allocator<char> *)&kv_split_no);
    }
    gguf_kv_to_str_abi_cxx11_
              (&kv_split_no,
               (local_228->_M_t).super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>._M_t.
               super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
               super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl,(int)uVar20);
    if (0x28 < kv_split_no._M_string_length) {
      std::__cxx11::string::substr((ulong)&local_188,(ulong)&kv_split_no);
      format_abi_cxx11_((string *)&buf,"%s...",local_188._M_dataplus._M_p);
      std::__cxx11::string::operator=((string *)&kv_split_no,(string *)&buf);
      std::__cxx11::string::~string((string *)&buf);
      std::__cxx11::string::~string((string *)&local_188);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&buf,"\n",(allocator<char> *)&local_26c);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_188,"\\n",&local_259);
    replace_all(&kv_split_no,(string *)&buf,&local_188);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)&buf);
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: - kv %3d: %42s %-16s = %s\n","llama_model_loader",
                       uVar20 & 0xffffffff,local_210,_ftype_val,
                       CONCAT44(kv_split_no._M_dataplus._M_p._4_4_,
                                (ggml_type)kv_split_no._M_dataplus._M_p));
    std::__cxx11::string::~string((string *)&kv_split_no);
    std::__cxx11::string::~string((string *)&ftype_val);
  }
  for (uVar25 = split_prefix.field_2._8_8_; (size_type *)uVar25 != &split_prefix._M_string_length;
      uVar25 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar25)) {
    if (*(int *)&((_Rb_tree_node_base *)(uVar25 + 0x20))->field_0x4 != 0) {
      uVar22 = ggml_type_name(((_Rb_tree_node_base *)(uVar25 + 0x20))->_M_color);
      llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: - type %4s: %4d tensors\n","llama_model_loader",
                         uVar22,(ulong)*(uint *)&((_Rb_tree_node_base *)(uVar25 + 0x20))->field_0x4)
      ;
    }
  }
  std::
  _Rb_tree<ggml_type,_std::pair<const_ggml_type,_unsigned_int>,_std::_Select1st<std::pair<const_ggml_type,_unsigned_int>_>,_std::less<ggml_type>,_std::allocator<std::pair<const_ggml_type,_unsigned_int>_>_>
  ::~_Rb_tree((_Rb_tree<ggml_type,_std::pair<const_ggml_type,_unsigned_int>,_std::_Select1st<std::pair<const_ggml_type,_unsigned_int>_>,_std::less<ggml_type>,_std::allocator<std::pair<const_ggml_type,_unsigned_int>_>_>
               *)&split_prefix);
  local_268->use_mmap = SUB41(local_1fc,0);
  local_268->check_tensors = check_tensors;
  return;
}

Assistant:

llama_model_loader::llama_model_loader(
        const std::string & fname,
        std::vector<std::string> & splits,
        bool use_mmap,
        bool check_tensors,
        const llama_model_kv_override * param_overrides_p,
        const llama_model_tensor_buft_override * param_tensor_buft_overrides_p) {
    int trace = 0;
    if (getenv("LLAMA_TRACE")) {
        trace = atoi(getenv("LLAMA_TRACE"));
    }

    if (param_overrides_p != nullptr) {
        for (const struct llama_model_kv_override * p = param_overrides_p; p->key[0] != 0; p++) {
            kv_overrides.insert({std::string(p->key), *p});
        }
    }

    tensor_buft_overrides = param_tensor_buft_overrides_p;

    // Load the main GGUF
    struct ggml_context * ctx = NULL;
    struct gguf_init_params params = {
        /*.no_alloc = */ true,
        /*.ctx      = */ &ctx,
    };

    meta.reset(gguf_init_from_file(fname.c_str(), params));
    if (!meta) {
        throw std::runtime_error(format("%s: failed to load model from %s\n", __func__, fname.c_str()));
    }

    get_key(llm_kv(LLM_KV_GENERAL_ARCHITECTURE), arch_name, false);
    llm_kv = LLM_KV(llm_arch_from_string(arch_name));

    files.emplace_back(new llama_file(fname.c_str(), "rb"));
    contexts.emplace_back(ctx);

    // Save tensors data offset of the main file.
    // For subsidiary files, `meta` tensor data offset must not be used,
    // so we build a unified tensors index for weights.
    for (ggml_tensor * cur = ggml_get_first_tensor(ctx); cur; cur = ggml_get_next_tensor(ctx, cur)) {
        std::string tensor_name = std::string(cur->name);
        // make sure there is no duplicated tensor names
        if (weights_map.find(tensor_name) != weights_map.end()) {
            throw std::runtime_error(format("invalid model: tensor '%s' is duplicated", ggml_get_name(cur)));
        }
        n_elements += ggml_nelements(cur);
        n_bytes    += ggml_nbytes(cur);
        weights_map.emplace(tensor_name, llama_tensor_weight(files.back().get(), 0, meta.get(), cur));
    }
    uint16_t n_split = 0;
    get_key(llm_kv(LLM_KV_SPLIT_COUNT), n_split, false);

    // Load additional GGML contexts
    if (n_split > 1) {
        // make sure the main file is loaded first
        uint16_t idx = 0;
        const std::string kv_split_no = llm_kv(LLM_KV_SPLIT_NO);
        get_key(kv_split_no, idx);
        if (idx != 0) {
            throw std::runtime_error(format("illegal split file idx: %d (file: %s), model must be loaded with the first split", idx, fname.c_str()));
        }

        // generate list of splits if needed
        if (splits.empty()) {
            splits = llama_get_list_splits(fname, idx, n_split);
        }

        // in case user give a custom list of splits, check if it matches the expected number
        if (n_split != (uint16_t)splits.size()) {
            throw std::runtime_error(format("invalid split count, given: %zu splits, but expected %d", splits.size(), n_split));
        }

        if (trace > 0) {
            LLAMA_LOG_INFO("%s: loading additional %d GGUFs\n", __func__, n_split);
        }

        // load other splits
        for (idx = 1; idx < n_split; idx++) {
            const char * fname_split = splits[idx].c_str();

            struct gguf_init_params split_params = {
                /*.no_alloc = */ true,
                /*.ctx      = */ &ctx,
            };
            gguf_context_ptr ctx_gguf { gguf_init_from_file(fname_split, split_params) };
            if (!ctx_gguf) {
                throw std::runtime_error(format("%s: failed to load GGUF split from %s\n", __func__, fname_split));
            }

            // check idx
            {
                const int kid = gguf_find_key(ctx_gguf.get(), kv_split_no.c_str());
                if (kid < 0) {
                    throw std::runtime_error(format("missing key %s in GGUF split %s", kv_split_no.c_str(), fname_split));
                }
                int idx_gguf = gguf_get_val_u16(ctx_gguf.get(), kid);
                if (idx_gguf != idx) {
                    throw std::runtime_error(format("invalid split file idx: %d (file: %s), expected %d", idx_gguf, fname_split, idx));
                }
            }

            files.emplace_back(new llama_file(fname_split, "rb"));
            contexts.emplace_back(ctx);

            // Save tensors data offset info of the shard.
            for (ggml_tensor * cur = ggml_get_first_tensor(ctx); cur; cur = ggml_get_next_tensor(ctx, cur)) {
                std::string tensor_name = std::string(cur->name);
                // make sure there is no duplicated tensor names
                if (weights_map.find(tensor_name) != weights_map.end()) {
                    throw std::runtime_error(format("invalid model: tensor '%s' is duplicated", ggml_get_name(cur)));
                }
                n_elements += ggml_nelements(cur);
                n_bytes    += ggml_nbytes(cur);
                weights_map.emplace(tensor_name, llama_tensor_weight(files.back().get(), idx, ctx_gguf.get(), cur));
            }
        }

        get_key(llm_kv(LLM_KV_SPLIT_TENSORS_COUNT), n_tensors);

        // sanity check
        {
            const int n_tensors_loaded = (int) weights_map.size();
            if (n_tensors != n_tensors_loaded) {
                throw std::runtime_error(format("corrupted model: %d tensors expected but %d found", n_tensors, n_tensors_loaded));
            }
        }

        LLAMA_LOG_INFO("%s: additional %d GGUFs metadata loaded.\n",  __func__, n_split - 1);
    }

    n_kv      = gguf_get_n_kv(meta.get());
    n_tensors = weights_map.size();

    fver = (enum llama_fver) gguf_get_version(meta.get());

    LLAMA_LOG_INFO("%s: loaded meta data with %d key-value pairs and %d tensors from %s (version %s)\n",
            __func__, n_kv, n_tensors, fname.c_str(), llama_file_version_name(fver));

    // determine file type based on the number of tensors for each quantization and print meta data
    // TODO: make optional
    {
        std::map<enum ggml_type, uint32_t> n_type;

        uint32_t n_type_max = 0;
        enum ggml_type type_max = GGML_TYPE_F32;

        for (const auto & it : weights_map) {
            const llama_tensor_weight & w = it.second;
            const ggml_tensor * tensor = w.tensor;

            enum ggml_type type = tensor->type;

            n_type[type]++;

            if (n_type_max < n_type[type]) {
                n_type_max = n_type[type];
                type_max   = type;
            }

            if (trace > 0) {
                const uint16_t sid = w.idx;
                LLAMA_LOG_INFO("%s: - tensor split %2d: %32s %-8s [ %s ] %8.2f MiB\n", __func__,
                        sid, ggml_get_name(tensor), ggml_type_name(type), llama_format_tensor_shape(tensor).c_str(),
                        ggml_nbytes(tensor)/1024.0f/1024.0f);
            }
        }

        switch (type_max) {
            case GGML_TYPE_F32:     ftype = LLAMA_FTYPE_ALL_F32;        break;
            case GGML_TYPE_F16:     ftype = LLAMA_FTYPE_MOSTLY_F16;     break;
            case GGML_TYPE_BF16:    ftype = LLAMA_FTYPE_MOSTLY_BF16;    break;
            case GGML_TYPE_Q4_0:    ftype = LLAMA_FTYPE_MOSTLY_Q4_0;    break;
            case GGML_TYPE_Q4_1:    ftype = LLAMA_FTYPE_MOSTLY_Q4_1;    break;
            case GGML_TYPE_Q5_0:    ftype = LLAMA_FTYPE_MOSTLY_Q5_0;    break;
            case GGML_TYPE_Q5_1:    ftype = LLAMA_FTYPE_MOSTLY_Q5_1;    break;
            case GGML_TYPE_Q8_0:    ftype = LLAMA_FTYPE_MOSTLY_Q8_0;    break;
            case GGML_TYPE_Q2_K:    ftype = LLAMA_FTYPE_MOSTLY_Q2_K;    break;
            case GGML_TYPE_Q3_K:    ftype = LLAMA_FTYPE_MOSTLY_Q3_K_M;  break;
            case GGML_TYPE_Q4_K:    ftype = LLAMA_FTYPE_MOSTLY_Q4_K_M;  break;
            case GGML_TYPE_Q5_K:    ftype = LLAMA_FTYPE_MOSTLY_Q5_K_M;  break;
            case GGML_TYPE_Q6_K:    ftype = LLAMA_FTYPE_MOSTLY_Q6_K;    break;
            case GGML_TYPE_TQ1_0:   ftype = LLAMA_FTYPE_MOSTLY_TQ1_0;   break;
            case GGML_TYPE_TQ2_0:   ftype = LLAMA_FTYPE_MOSTLY_TQ2_0;   break;
            case GGML_TYPE_IQ2_XXS: ftype = LLAMA_FTYPE_MOSTLY_IQ2_XXS; break;
            case GGML_TYPE_IQ2_XS:  ftype = LLAMA_FTYPE_MOSTLY_IQ2_XS;  break;
            case GGML_TYPE_IQ2_S:   ftype = LLAMA_FTYPE_MOSTLY_IQ2_S;   break;
            case GGML_TYPE_IQ3_XXS: ftype = LLAMA_FTYPE_MOSTLY_IQ3_XXS; break;
            case GGML_TYPE_IQ1_S:   ftype = LLAMA_FTYPE_MOSTLY_IQ1_S;   break;
            case GGML_TYPE_IQ1_M:   ftype = LLAMA_FTYPE_MOSTLY_IQ1_M;   break;
            case GGML_TYPE_IQ4_NL:  ftype = LLAMA_FTYPE_MOSTLY_IQ4_NL;  break;
            case GGML_TYPE_IQ4_XS:  ftype = LLAMA_FTYPE_MOSTLY_IQ4_XS;  break;
            case GGML_TYPE_IQ3_S:   ftype = LLAMA_FTYPE_MOSTLY_IQ3_S;   break;
            default:
                {
                    LLAMA_LOG_WARN("%s: unknown type %s\n", __func__, ggml_type_name(type_max));
                    ftype = LLAMA_FTYPE_ALL_F32;
                } break;
        }

        // this is a way to mark that we have "guessed" the file type
        ftype = (llama_ftype) (ftype | LLAMA_FTYPE_GUESSED);

        {
            uint32_t ftype_val = 0;
            if (get_key(LLM_KV_GENERAL_FILE_TYPE, ftype_val, false)) {
                ftype = (llama_ftype) ftype_val;
            }
        }

        LLAMA_LOG_INFO("%s: Dumping metadata keys/values. Note: KV overrides do not apply in this output.\n", __func__);

        for (int i = 0; i < n_kv; i++) {
            const char * name           = gguf_get_key(meta.get(), i);
            const enum gguf_type type   = gguf_get_kv_type(meta.get(), i);
            const std::string type_name =
                type == GGUF_TYPE_ARRAY
                ? format("%s[%s,%zu]", gguf_type_name(type), gguf_type_name(gguf_get_arr_type(meta.get(), i)), gguf_get_arr_n(meta.get(), i))
                : gguf_type_name(type);

            std::string value          = gguf_kv_to_str(meta.get(), i);
            const size_t MAX_VALUE_LEN = 40;
            if (value.size() > MAX_VALUE_LEN) {
                value = format("%s...", value.substr(0, MAX_VALUE_LEN - 3).c_str());
            }
            replace_all(value, "\n", "\\n");

            LLAMA_LOG_INFO("%s: - kv %3d: %42s %-16s = %s\n", __func__, i, name, type_name.c_str(), value.c_str());
        }

        // print type counts
        for (auto & kv : n_type) {
            if (kv.second == 0) {
                continue;
            }

            LLAMA_LOG_INFO("%s: - type %4s: %4d tensors\n", __func__, ggml_type_name(kv.first), kv.second);
        }
    }

    if (!llama_mmap::SUPPORTED) {
        LLAMA_LOG_WARN("%s: mmap is not supported on this platform\n", __func__);
        use_mmap = false;
    }

    this->use_mmap = use_mmap;
    this->check_tensors = check_tensors;
}